

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall VertexAttrib64Bit::ApiErrorsTest::invalidOperation(ApiErrorsTest *this,bool *result)

{
  void *pvVar1;
  GLenum err;
  ostream *poVar2;
  long lVar3;
  char *local_1d8 [4];
  stringstream message;
  ostream local_1a8;
  
  (*(this->super_Base).gl.bindBuffer)(0x8892,0);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x1b5);
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
    pvVar1 = *(void **)((long)invalidOperation::pointer_array + lVar3);
    std::__cxx11::stringstream::stringstream((stringstream *)&message);
    poVar2 = std::operator<<(&local_1a8,"VertexAttribLPointer(..., ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::operator<<(poVar2," /* pointer */)");
    (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,0,pvVar1);
    std::__cxx11::stringbuf::str();
    verifyError(this,0x502,local_1d8[0],0x1bf,result);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&message);
  }
  return;
}

Assistant:

void ApiErrorsTest::invalidOperation(bool& result)
{

	/*
	 *e) GL_INVALID_OPERATION should be generated by glVertexAttribLPointer()
	 *   if zero is bound to the GL_ARRAY_BUFFER buffer object binding
	 *   point and the <pointer> argument is not NULL.
	 */
	static const GLvoid* pointer_array[]	  = { (GLvoid*)1, (GLvoid*)4, (GLvoid*)-16 };
	static const GLuint  pointer_array_length = sizeof(pointer_array) / sizeof(pointer_array[0]);

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	for (GLuint i = 0; i < pointer_array_length; ++i)
	{
		const GLvoid* pointer = pointer_array[i];

		std::stringstream message;
		message << "VertexAttribLPointer(..., " << pointer << " /* pointer */)";

		gl.vertexAttribLPointer(1 /* index */, 4 /*size */, GL_DOUBLE, 0 /* stride */, pointer);
		verifyError(GL_INVALID_OPERATION, message.str().c_str(), __LINE__, result);
	}
}